

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
               (ParamsStream<DataStream_&,_TransactionSerParams> *s,int *args,uint256 *args_1,
               uint256 *args_2,uint *args_3,uint *args_4,uint *args_5)

{
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = *args;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_3c);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,args_1,args_1 + 1);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,args_2,args_2 + 1);
  local_3c = *args_3;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_3c,&local_38);
  local_3c = *args_4;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_3c,&local_38);
  local_3c = *args_5;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_3c,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}